

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall glslang::HlslGrammar::acceptTextureType(HlslGrammar *this,TType *type)

{
  TLayoutFormat TVar1;
  bool bVar2;
  EHlslTokenClass EVar3;
  int iVar4;
  TBasicType TVar5;
  int iVar6;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *this_00;
  const_reference pvVar7;
  undefined4 extraout_var;
  TBasicType local_1a4;
  TType local_188;
  TBasicType local_f0;
  TLayoutFormat local_ec;
  TBasicType txBasicType;
  TLayoutFormat format;
  TSampler sampler;
  bool shadow;
  TArraySizes *arraySizes;
  TBasicType basicRetType;
  TIntermTyped *msCount;
  TType txType;
  TSamplerDim local_28;
  bool combined;
  bool image;
  bool ms;
  bool array;
  TSamplerDim dim;
  EHlslTokenClass textureType;
  TType *type_local;
  HlslGrammar *this_local;
  
  EVar3 = HlslTokenStream::peek(&this->super_HlslTokenStream);
  txType.spirvType._7_1_ = 0;
  txType.spirvType._6_1_ = 0;
  txType.spirvType._5_1_ = 0;
  txType.spirvType._4_1_ = 1;
  if (EVar3 == EHTokBuffer) {
    local_28 = EsdBuffer;
    txType.spirvType._4_1_ = 0;
  }
  else if (EVar3 == EHTokTexture1d) {
    local_28 = Esd1D;
  }
  else if (EVar3 == EHTokTexture1darray) {
    local_28 = Esd1D;
    txType.spirvType._7_1_ = 1;
  }
  else if (EVar3 == EHTokTexture2d) {
    local_28 = Esd2D;
  }
  else if (EVar3 == EHTokTexture2darray) {
    local_28 = Esd2D;
    txType.spirvType._7_1_ = 1;
  }
  else if (EVar3 == EHTokTexture3d) {
    local_28 = Esd3D;
  }
  else if (EVar3 == EHTokTextureCube) {
    local_28 = EsdCube;
  }
  else if (EVar3 == EHTokTextureCubearray) {
    local_28 = EsdCube;
    txType.spirvType._7_1_ = 1;
  }
  else if (EVar3 == EHTokTexture2DMS) {
    local_28 = Esd2D;
    txType.spirvType._6_1_ = 1;
  }
  else if (EVar3 == EHTokTexture2DMSarray) {
    local_28 = Esd2D;
    txType.spirvType._7_1_ = 1;
    txType.spirvType._6_1_ = 1;
  }
  else if (EVar3 == EHTokRWTexture1d) {
    local_28 = Esd1D;
    txType.spirvType._7_1_ = 0;
    txType.spirvType._5_1_ = 1;
  }
  else if (EVar3 == EHTokRWTexture1darray) {
    local_28 = Esd1D;
    txType.spirvType._7_1_ = 1;
    txType.spirvType._5_1_ = 1;
  }
  else if (EVar3 == EHTokRWTexture2d) {
    local_28 = Esd2D;
    txType.spirvType._7_1_ = 0;
    txType.spirvType._5_1_ = 1;
  }
  else if (EVar3 == EHTokRWTexture2darray) {
    local_28 = Esd2D;
    txType.spirvType._7_1_ = 1;
    txType.spirvType._5_1_ = 1;
  }
  else if (EVar3 == EHTokRWTexture3d) {
    local_28 = Esd3D;
    txType.spirvType._7_1_ = 0;
    txType.spirvType._5_1_ = 1;
  }
  else {
    if (EVar3 != EHTokRWBuffer) {
      return false;
    }
    local_28 = EsdBuffer;
    txType.spirvType._5_1_ = 1;
  }
  HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
  TType::TType((TType *)&msCount,EbtFloat,EvqUniform,4,0,0,false);
  _basicRetType = (TIntermTyped *)0x0;
  bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftAngle);
  if (bVar2) {
    bVar2 = acceptType(this,(TType *)&msCount);
    if (!bVar2) {
      expected(this,"scalar or vector type");
      this_local._7_1_ = false;
      goto LAB_0067884b;
    }
    TVar5 = TType::getBasicType((TType *)&msCount);
    if (((TVar5 != EbtFloat) && (1 < TVar5 - EbtInt)) && (TVar5 != EbtStruct)) {
      unimplemented(this,"basic type in texture");
      this_local._7_1_ = false;
      goto LAB_0067884b;
    }
    if ((local_28 == EsdBuffer) && (bVar2 = TType::isMatrix((TType *)&msCount), bVar2)) {
      iVar6 = TType::getMatrixCols((TType *)&msCount);
      iVar4 = TType::getMatrixRows((TType *)&msCount);
      if (iVar6 * iVar4 < 5) {
        unimplemented(this,"matrix type in buffer");
        this_local._7_1_ = false;
      }
      else {
        expected(this,"components < 4 in matrix buffer type");
        this_local._7_1_ = false;
      }
      goto LAB_0067884b;
    }
    bVar2 = TType::isScalar((TType *)&msCount);
    if ((!bVar2) &&
       ((bVar2 = TType::isVector((TType *)&msCount), !bVar2 &&
        (bVar2 = TType::isStruct((TType *)&msCount), !bVar2)))) {
      expected(this,"scalar, vector, or struct type");
      this_local._7_1_ = false;
      goto LAB_0067884b;
    }
    if (((txType.spirvType._6_1_ & 1) != 0) &&
       (bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokComma), bVar2))
    {
      bVar2 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokIntConstant);
      if (!bVar2) {
        expected(this,"multisample count");
        this_local._7_1_ = false;
        goto LAB_0067884b;
      }
      bVar2 = acceptLiteral(this,(TIntermTyped **)&basicRetType);
      if (!bVar2) {
        this_local._7_1_ = false;
        goto LAB_0067884b;
      }
    }
    bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightAngle);
    if (!bVar2) {
      expected(this,"right angle bracket");
      this_local._7_1_ = false;
      goto LAB_0067884b;
    }
  }
  else {
    if ((txType.spirvType._6_1_ & 1) != 0) {
      expected(this,"texture type for multisample");
      this_local._7_1_ = false;
      goto LAB_0067884b;
    }
    if ((txType.spirvType._5_1_ & 1) != 0) {
      expected(this,"type for RWTexture/RWBuffer");
      this_local._7_1_ = false;
      goto LAB_0067884b;
    }
  }
  _sampler = (TArraySizes *)0x0;
  format._3_1_ = ElfNone >> 0x18;
  local_ec = ElfNone;
  if (((txType.spirvType._5_1_ & 1) != 0) || (local_28 == EsdBuffer)) {
    local_ec = HlslParseContext::getLayoutFromTxType
                         (this->parseContext,&(this->super_HlslTokenStream).token.loc,
                          (TType *)&msCount);
  }
  bVar2 = TType::isStruct((TType *)&msCount);
  if (bVar2) {
    this_00 = &TType::getStruct((TType *)&msCount)->
               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
    pvVar7 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::operator[]
                       (this_00,0);
    local_1a4 = (*pvVar7->type->_vptr_TType[7])();
  }
  else {
    local_1a4 = TType::getBasicType((TType *)&msCount);
  }
  local_f0 = local_1a4;
  if ((local_28 == EsdBuffer) && ((txType.spirvType._5_1_ & 1) == 0)) {
    TVar5 = TType::getBasicType((TType *)&msCount);
    TSampler::set((TSampler *)&txBasicType,TVar5,EsdBuffer,(bool)(txType.spirvType._7_1_ & 1),false,
                  false);
  }
  else if ((txType.spirvType._5_1_ & 1) == 0) {
    TSampler::setTexture
              ((TSampler *)&txBasicType,local_1a4,local_28,(bool)(txType.spirvType._7_1_ & 1),false,
               (bool)(txType.spirvType._6_1_ & 1));
  }
  else {
    TSampler::setImage((TSampler *)&txBasicType,local_1a4,local_28,
                       (bool)(txType.spirvType._7_1_ & 1),false,(bool)(txType.spirvType._6_1_ & 1));
  }
  bVar2 = HlslParseContext::setTextureReturnType
                    (this->parseContext,(TSampler *)&txBasicType,(TType *)&msCount,
                     &(this->super_HlslTokenStream).token.loc);
  if (bVar2) {
    if ((txType.spirvType._4_1_ & 1) == 0) {
      txBasicType = txBasicType & 0xffefffff;
    }
    TType::TType(&local_188,(TSampler *)&txBasicType,EvqUniform,_sampler);
    TType::shallowCopy(type,&local_188);
    TType::~TType(&local_188);
    TVar1 = local_ec;
    iVar6 = (*type->_vptr_TType[10])();
    *(char *)(CONCAT44(extraout_var,iVar6) + 0x2c) = (char)TVar1;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
LAB_0067884b:
  TType::~TType((TType *)&msCount);
  return this_local._7_1_;
}

Assistant:

bool HlslGrammar::acceptTextureType(TType& type)
{
    const EHlslTokenClass textureType = peek();

    TSamplerDim dim = EsdNone;
    bool array = false;
    bool ms    = false;
    bool image = false;
    bool combined = true;

    switch (textureType) {
    case EHTokBuffer:            dim = EsdBuffer; combined = false;    break;
    case EHTokTexture1d:         dim = Esd1D;                          break;
    case EHTokTexture1darray:    dim = Esd1D; array = true;            break;
    case EHTokTexture2d:         dim = Esd2D;                          break;
    case EHTokTexture2darray:    dim = Esd2D; array = true;            break;
    case EHTokTexture3d:         dim = Esd3D;                          break;
    case EHTokTextureCube:       dim = EsdCube;                        break;
    case EHTokTextureCubearray:  dim = EsdCube; array = true;          break;
    case EHTokTexture2DMS:       dim = Esd2D; ms = true;               break;
    case EHTokTexture2DMSarray:  dim = Esd2D; array = true; ms = true; break;
    case EHTokRWBuffer:          dim = EsdBuffer; image=true;          break;
    case EHTokRWTexture1d:       dim = Esd1D; array=false; image=true; break;
    case EHTokRWTexture1darray:  dim = Esd1D; array=true;  image=true; break;
    case EHTokRWTexture2d:       dim = Esd2D; array=false; image=true; break;
    case EHTokRWTexture2darray:  dim = Esd2D; array=true;  image=true; break;
    case EHTokRWTexture3d:       dim = Esd3D; array=false; image=true; break;
    default:
        return false;  // not a texture declaration
    }

    advanceToken();  // consume the texture object keyword

    TType txType(EbtFloat, EvqUniform, 4); // default type is float4

    TIntermTyped* msCount = nullptr;

    // texture type: required for multisample types and RWBuffer/RWTextures!
    if (acceptTokenClass(EHTokLeftAngle)) {
        if (! acceptType(txType)) {
            expected("scalar or vector type");
            return false;
        }

        const TBasicType basicRetType = txType.getBasicType() ;

        switch (basicRetType) {
        case EbtFloat:
        case EbtUint:
        case EbtInt:
        case EbtStruct:
            break;
        default:
            unimplemented("basic type in texture");
            return false;
        }

        // Buffers can handle small mats if they fit in 4 components
        if (dim == EsdBuffer && txType.isMatrix()) {
            if ((txType.getMatrixCols() * txType.getMatrixRows()) > 4) {
                expected("components < 4 in matrix buffer type");
                return false;
            }

            // TODO: except we don't handle it yet...
            unimplemented("matrix type in buffer");
            return false;
        }

        if (!txType.isScalar() && !txType.isVector() && !txType.isStruct()) {
            expected("scalar, vector, or struct type");
            return false;
        }

        if (ms && acceptTokenClass(EHTokComma)) {
            // read sample count for multisample types, if given
            if (! peekTokenClass(EHTokIntConstant)) {
                expected("multisample count");
                return false;
            }

            if (! acceptLiteral(msCount))  // should never fail, since we just found an integer
                return false;
        }

        if (! acceptTokenClass(EHTokRightAngle)) {
            expected("right angle bracket");
            return false;
        }
    } else if (ms) {
        expected("texture type for multisample");
        return false;
    } else if (image) {
        expected("type for RWTexture/RWBuffer");
        return false;
    }

    TArraySizes* arraySizes = nullptr;
    const bool shadow = false; // declared on the sampler

    TSampler sampler;
    TLayoutFormat format = ElfNone;

    // Buffer, RWBuffer and RWTexture (images) require a TLayoutFormat.  We handle only a limit set.
    if (image || dim == EsdBuffer)
        format = parseContext.getLayoutFromTxType(token.loc, txType);

    const TBasicType txBasicType = txType.isStruct() ? (*txType.getStruct())[0].type->getBasicType()
        : txType.getBasicType();

    // Non-image Buffers are combined
    if (dim == EsdBuffer && !image) {
        sampler.set(txType.getBasicType(), dim, array);
    } else {
        // DX10 textures are separated.  TODO: DX9.
        if (image) {
            sampler.setImage(txBasicType, dim, array, shadow, ms);
        } else {
            sampler.setTexture(txBasicType, dim, array, shadow, ms);
        }
    }

    // Remember the declared return type.  Function returns false on error.
    if (!parseContext.setTextureReturnType(sampler, txType, token.loc))
        return false;

    // Force uncombined, if necessary
    if (!combined)
        sampler.combined = false;

    type.shallowCopy(TType(sampler, EvqUniform, arraySizes));
    type.getQualifier().layoutFormat = format;

    return true;
}